

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL Js::JavascriptProxy::TestIntegrityLevel
               (IntegrityLevel integrityLevel,RecyclableObject *obj,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  PropertyId propertyId_00;
  BOOL BVar6;
  undefined4 *puVar7;
  JavascriptArray *this;
  Var aValue;
  bool bVar8;
  uint local_7c;
  PropertyId propertyId;
  uint i;
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  bool configurable;
  bool writable;
  Var itemVar;
  JavascriptArray *resultArray;
  BOOL isExtensible;
  ScriptContext *scriptContext_local;
  RecyclableObject *obj_local;
  IntegrityLevel integrityLevel_local;
  undefined4 extraout_var;
  
  iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x33])();
  if (iVar4 == 0) {
    bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x4ff,"(VarIs<JavascriptProxy>(obj))",
                                  "VarIs<JavascriptProxy>(obj)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this = Js::JavascriptOperators::GetOwnPropertyKeys(obj,scriptContext);
    bVar8 = false;
    bVar2 = false;
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyId);
    for (local_7c = 0; uVar5 = ArrayObject::GetLength(&this->super_ArrayObject), local_7c < uVar5;
        local_7c = local_7c + 1) {
      iVar4 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(this,(ulong)local_7c);
      aValue = (Var)CONCAT44(extraout_var,iVar4);
      bVar3 = VarIs<Js::JavascriptSymbol>(aValue);
      if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptString>(aValue), !bVar3)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x511,
                                    "(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar))"
                                    ,
                                    "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      JavascriptConversion::ToPropertyKey
                (aValue,scriptContext,(PropertyRecord **)&propertyDescriptor.Configurable,
                 (PropertyString **)0x0);
      propertyId_00 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
      BVar6 = JavascriptObject::GetOwnPropertyDescriptorHelper
                        (obj,propertyId_00,scriptContext,(PropertyDescriptor *)&propertyId);
      if (BVar6 != 0) {
        bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&propertyId);
        bVar2 = bVar2 || bVar3;
        bVar3 = PropertyDescriptor::IsDataDescriptor((PropertyDescriptor *)&propertyId);
        if (bVar3) {
          bVar3 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&propertyId);
          bVar8 = bVar8 || bVar3;
        }
      }
    }
    if ((integrityLevel == IntegrityLevel_frozen) && (bVar8)) {
      obj_local._4_4_ = 0;
    }
    else if (bVar2) {
      obj_local._4_4_ = 0;
    }
    else {
      obj_local._4_4_ = 1;
    }
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::TestIntegrityLevel(IntegrityLevel integrityLevel, RecyclableObject* obj, ScriptContext* scriptContext)
    {
        //1. Assert: Type(O) is Object.
        //2. Assert: level is either "sealed" or "frozen".

        //3. Let status be IsExtensible(O).
        //4. ReturnIfAbrupt(status).
        //5. If status is true, then return false
        //6. NOTE If the object is extensible, none of its properties are examined.
        BOOL isExtensible = obj->IsExtensible();
        if (isExtensible)
        {
            return FALSE;
        }

        // at this time this is called from proxy only; when we extend this to other objects, we need to handle the other codepath.
        //7. Let keys be O.[[OwnPropertyKeys]]().
        //8. ReturnIfAbrupt(keys).
        Assert(VarIs<JavascriptProxy>(obj));
        JavascriptArray* resultArray = JavascriptOperators::GetOwnPropertyKeys(obj, scriptContext);

        //9. Repeat for each element k of keys,
        //      a. Let currentDesc be O.[[GetOwnProperty]](k).
        //      b. ReturnIfAbrupt(currentDesc).
        //      c. If currentDesc is not undefined, then
        //          i. If currentDesc.[[Configurable]] is true, return false.
        //          ii. If level is "frozen" and IsDataDescriptor(currentDesc) is true, then
        //              1. If currentDesc.[[Writable]] is true, return false.
        Var itemVar;
        bool writable = false;
        bool configurable = false;
        const PropertyRecord* propertyRecord;
        PropertyDescriptor propertyDescriptor;
        for (uint i = 0; i < resultArray->GetLength(); i++)
        {
            itemVar = resultArray->DirectGetItem(i);
            AssertMsg(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
            JavascriptConversion::ToPropertyKey(itemVar, scriptContext, &propertyRecord, nullptr);
            PropertyId propertyId = propertyRecord->GetPropertyId();
            if (JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propertyId, scriptContext, propertyDescriptor))
            {
                configurable |= propertyDescriptor.IsConfigurable();
                if (propertyDescriptor.IsDataDescriptor())
                {
                    writable |= propertyDescriptor.IsWritable();
                }
            }
        }
        if (integrityLevel == IntegrityLevel::IntegrityLevel_frozen && writable)
        {
            return FALSE;
        }
        if (configurable)
        {
            return FALSE;
        }
        return TRUE;
    }